

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O3

bool comparesEqual(QTimeZone *lhs,QTimeZone *rhs)

{
  QTimeZonePrivate *this;
  QTimeZonePrivate *other;
  bool bVar1;
  
  this = (lhs->d).d;
  other = (rhs->d).d;
  if (((ulong)this & 3) != 0) {
    return this == other && ((ulong)other & 3) != 0;
  }
  if (((ulong)other & 3) == 0) {
    if (this == other) {
      return true;
    }
    if (other != (QTimeZonePrivate *)0x0 && this != (QTimeZonePrivate *)0x0) {
      bVar1 = QTimeZonePrivate::operator==(this,other);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool comparesEqual(const QTimeZone &lhs, const QTimeZone &rhs) noexcept
{
    if (lhs.d.isShort())
        return rhs.d.isShort() && lhs.d.s == rhs.d.s;

    if (!rhs.d.isShort()) {
        if (lhs.d.d == rhs.d.d)
            return true;
#if QT_CONFIG(timezone)
        return lhs.d.d && rhs.d.d && *lhs.d.d == *rhs.d.d;
#endif
    }

    return false;
}